

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

CFeeRate wallet::GetDiscardRate(CWallet *wallet)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  Chain *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CFeeRate CVar7;
  long lVar8;
  long in_FS_OFFSET;
  long lVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = CWallet::chain(wallet);
  uVar3 = (*pCVar5->_vptr_Chain[0x1c])(pCVar5);
  pCVar5 = CWallet::chain(wallet);
  iVar4 = (*pCVar5->_vptr_Chain[0x1b])(pCVar5,(ulong)uVar3,0,0);
  lVar6 = CONCAT44(extraout_var,iVar4);
  lVar2 = (wallet->m_discard_rate).nSatoshisPerK;
  lVar8 = lVar6;
  if (lVar2 < lVar6) {
    lVar8 = lVar2;
  }
  if (lVar6 == 0) {
    lVar8 = lVar2;
  }
  pCVar5 = CWallet::chain(wallet);
  iVar4 = (*pCVar5->_vptr_Chain[0x20])(pCVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CVar7.nSatoshisPerK = CONCAT44(extraout_var_00,iVar4);
    if (CONCAT44(extraout_var_00,iVar4) < lVar8) {
      CVar7.nSatoshisPerK = lVar8;
    }
    return (CFeeRate)CVar7.nSatoshisPerK;
  }
  __stack_chk_fail();
}

Assistant:

CFeeRate GetDiscardRate(const CWallet& wallet)
{
    unsigned int highest_target = wallet.chain().estimateMaxBlocks();
    CFeeRate discard_rate = wallet.chain().estimateSmartFee(highest_target, /*conservative=*/false);
    // Don't let discard_rate be greater than longest possible fee estimate if we get a valid fee estimate
    discard_rate = (discard_rate == CFeeRate(0)) ? wallet.m_discard_rate : std::min(discard_rate, wallet.m_discard_rate);
    // Discard rate must be at least dust relay feerate
    discard_rate = std::max(discard_rate, wallet.chain().relayDustFee());
    return discard_rate;
}